

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_deconvolution_activation(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  FILE *__stream;
  bool bVar3;
  size_type sVar4;
  reference ppLVar5;
  reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  reference pvVar10;
  long in_RDI;
  int top_blob_index_final;
  Clip *clip;
  ReLU *relu;
  Layer *activation;
  Deconvolution *deconvolution;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  Allocator *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  Mat *in_stack_ffffffffffffff00;
  Mat local_c8;
  value_type local_88;
  value_type local_30;
  value_type local_28;
  value_type local_20;
  int local_18;
  value_type local_14;
  int local_10;
  int local_c;
  
  sVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_c = (int)sVar4;
  local_10 = 0;
  do {
    if (local_c <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (char *)in_stack_fffffffffffffee8);
    if (!bVar3) {
      ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->tops,0);
      local_14 = *pvVar6;
      local_18 = local_10;
LAB_001173ff:
      do {
        do {
          local_18 = local_18 + 1;
          if (local_c <= local_18) goto LAB_00117517;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                     (long)local_18);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (char *)in_stack_fffffffffffffee8);
          if (bVar3) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_18);
            bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                    ,(char *)in_stack_fffffffffffffee8);
            if (bVar3) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         (long)local_18);
              bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0),
                                      (char *)in_stack_fffffffffffffee8);
              if (bVar3) goto LAB_001173ff;
            }
          }
          ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_18);
          sVar4 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar5)->bottoms);
        } while (sVar4 != 1);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_18);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->bottoms,0);
      } while (*pvVar6 != local_14);
LAB_00117517:
      if (local_18 != local_c) {
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        local_20 = *ppLVar5;
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_18);
        __stream = _stderr;
        local_28 = *ppLVar5;
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_deconvolution_activation %s %s\n",uVar7,uVar8);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (char *)in_stack_fffffffffffffee8);
        if (bVar3) {
          local_30 = local_28;
          if ((*(float *)&local_28[1]._vptr_Layer != 0.0) ||
             (NAN(*(float *)&local_28[1]._vptr_Layer))) {
            *(undefined4 *)((long)&local_20[1].name.field_2 + 4) = 2;
            ncnn::Mat::Mat(in_stack_ffffffffffffff00,(int)in_stack_fffffffffffffefc,
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffee8);
            ncnn::Mat::operator=
                      ((Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            ncnn::Mat::~Mat((Mat *)0x11767b);
            fVar1 = *(float *)&local_30[1]._vptr_Layer;
            pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_20[1].name.field_2 + 8),0);
            *pfVar9 = fVar1;
          }
          else {
            *(undefined4 *)((long)&local_20[1].name.field_2 + 4) = 1;
          }
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (char *)in_stack_fffffffffffffee8);
          if (bVar3) {
            local_88 = local_28;
            *(undefined4 *)((long)&local_20[1].name.field_2 + 4) = 3;
            in_stack_ffffffffffffff00 = &local_c8;
            ncnn::Mat::Mat(in_stack_ffffffffffffff00,(int)in_stack_fffffffffffffefc,
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           in_stack_fffffffffffffee8);
            ncnn::Mat::operator=
                      ((Mat *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            ncnn::Mat::~Mat((Mat *)0x117763);
            in_stack_fffffffffffffef8 = *(float *)&local_88[1]._vptr_Layer;
            pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_20[1].name.field_2 + 8),0);
            *pfVar9 = in_stack_fffffffffffffef8;
            in_stack_fffffffffffffefc = *(float *)((long)&local_88[1]._vptr_Layer + 4);
            pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_20[1].name.field_2 + 8),1);
            *pfVar9 = in_stack_fffffffffffffefc;
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                    ,(char *)in_stack_fffffffffffffee8);
            if (bVar3) {
              *(undefined4 *)((long)&local_20[1].name.field_2 + 4) = 4;
            }
          }
        }
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_28->tops,0);
        iVar2 = *pvVar6;
        in_stack_fffffffffffffef0 = iVar2;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->tops,0);
        *pvVar6 = in_stack_fffffffffffffef0;
        in_stack_fffffffffffffef4 = local_10;
        pvVar10 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                             (long)iVar2);
        pvVar10->producer = in_stack_fffffffffffffef4;
        std::__cxx11::string::operator=((string *)&local_28->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolution_activation()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - Activation
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - Activation to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_deconvolution_activation %s %s\n", deconvolution->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                deconvolution->activation_type = 1;
            }
            else
            {
                deconvolution->activation_type = 2;
                deconvolution->activation_params = ncnn::Mat(1);
                deconvolution->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            deconvolution->activation_type = 3;
            deconvolution->activation_params = ncnn::Mat(2);
            deconvolution->activation_params[0] = clip->min;
            deconvolution->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            deconvolution->activation_type = 4;
        }

        int top_blob_index_final = activation->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}